

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O3

string * trun::rtrim(string *str,string *chars)

{
  size_type sVar1;
  ulong uVar2;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(str,(chars->_M_dataplus)._M_p,0xffffffffffffffff,chars->_M_string_length)
  ;
  uVar2 = sVar1 + 1;
  if (uVar2 <= str->_M_string_length) {
    str->_M_string_length = uVar2;
    (str->_M_dataplus)._M_p[uVar2] = '\0';
    return str;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar2);
}

Assistant:

std::string& rtrim(std::string& str, const std::string& chars /* = "\t\n\v\f\r " */) {
        str.erase(str.find_last_not_of(chars) + 1);
        return str;
    }